

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  char local_62 [2];
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_50 [8];
  string expr;
  ColourGuard local_20;
  TapAssertionPrinter *local_10;
  TapAssertionPrinter *this_local;
  
  local_10 = this;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    poVar2 = this->stream;
    ColourImpl::guardColour((ColourImpl *)&local_20,(Code)this->colourImpl);
    poVar2 = Catch::operator<<(poVar2,&local_20);
    std::operator<<(poVar2," for: ");
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_50,this->result);
    local_58._M_current = (char *)std::__cxx11::string::begin();
    local_60 = (char *)std::__cxx11::string::end();
    local_62[1] = 10;
    local_62[0] = ' ';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_58,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_60,local_62 + 1,local_62);
    std::operator<<(this->stream,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    stream << colourImpl->guardColour( tapDimColour ) << " for: ";

                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }